

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast(char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  LZ4_stream_t ctx;
  undefined1 local_4020 [16416];
  
  iVar1 = LZ4_compress_fast_extState(local_4020,source,dest,inputSize,maxOutputSize,acceleration);
  return iVar1;
}

Assistant:

int LZ4_compress_fast(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    int result;
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctxPtr = ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctxPtr == NULL) return 0;
#else
    LZ4_stream_t ctx;
    LZ4_stream_t* const ctxPtr = &ctx;
#endif
    result = LZ4_compress_fast_extState(ctxPtr, source, dest, inputSize, maxOutputSize, acceleration);

#if (LZ4_HEAPMODE)
    FREEMEM(ctxPtr);
#endif
    return result;
}